

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# report.c
# Opt level: O0

void parse_command_output
               (char *full_output,size_t full_output_size,char *stdio_buffer,
               size_t stdio_buffer_size,char *error_buffer,size_t error_buffer_size)

{
  int iVar1;
  char *__n;
  ulong local_48;
  size_t cont_zeros_count;
  size_t message_length;
  size_t error_buffer_size_local;
  char *error_buffer_local;
  size_t stdio_buffer_size_local;
  char *stdio_buffer_local;
  size_t full_output_size_local;
  char *full_output_local;
  
  memset(stdio_buffer,0,stdio_buffer_size);
  memset(error_buffer,0,error_buffer_size);
  message_length = error_buffer_size;
  error_buffer_size_local = (size_t)error_buffer;
  error_buffer_local = (char *)stdio_buffer_size;
  stdio_buffer_size_local = (size_t)stdio_buffer;
  stdio_buffer_local = (char *)full_output_size;
  full_output_size_local = (size_t)full_output;
  if (full_output[full_output_size - 1] != '\0') {
    return;
  }
  do {
    local_48 = 0;
    while (*(char *)full_output_size_local == '\0') {
      local_48 = local_48 + 1;
      full_output_size_local = full_output_size_local + 1;
      stdio_buffer_local = stdio_buffer_local + -1;
      if (stdio_buffer_local == (char *)0x0) {
        return;
      }
    }
    iVar1 = pcut_str_size((char *)full_output_size_local);
    __n = (char *)(long)iVar1;
    if (local_48 < 2) {
      if (error_buffer_local < __n) {
        return;
      }
      memcpy((void *)stdio_buffer_size_local,(void *)full_output_size_local,(size_t)__n);
      stdio_buffer_size_local = (size_t)(__n + stdio_buffer_size_local);
      error_buffer_local = error_buffer_local + -(long)__n;
    }
    else {
      if (message_length < __n) {
        return;
      }
      memcpy((void *)error_buffer_size_local,(void *)full_output_size_local,(size_t)__n);
      error_buffer_size_local = (size_t)(__n + error_buffer_size_local);
      message_length = message_length - (long)__n;
    }
    full_output_size_local = (size_t)(__n + full_output_size_local + 1);
    stdio_buffer_local = stdio_buffer_local + -(long)(__n + 1);
  } while( true );
}

Assistant:

static void parse_command_output(const char *full_output, size_t full_output_size,
		char *stdio_buffer, size_t stdio_buffer_size,
		char *error_buffer, size_t error_buffer_size) {
	memset(stdio_buffer, 0, stdio_buffer_size);
	memset(error_buffer, 0, error_buffer_size);

	/* Ensure that we do not read past the full_output. */
	if (full_output[full_output_size - 1] != 0) {
		/* FIXME: can this happen? */
		return;
	}

	while (1) {
		size_t message_length;

		/* First of all, count number of zero bytes before the text. */
		size_t cont_zeros_count = 0;
		while (full_output[0] == 0) {
			cont_zeros_count++;
			full_output++;
			full_output_size--;
			if (full_output_size == 0) {
				return;
			}
		}

		/* Determine the length of the text after the zeros. */
		message_length = pcut_str_size(full_output);

		if (cont_zeros_count < 2) {
			/* Okay, standard I/O. */
			if (message_length > stdio_buffer_size) {
				/* TODO: handle gracefully */
				return;
			}
			memcpy(stdio_buffer, full_output, message_length);
			stdio_buffer += message_length;
			stdio_buffer_size -= message_length;
		} else {
			/* Error message. */
			if (message_length > error_buffer_size) {
				/* TODO: handle gracefully */
				return;
			}
			memcpy(error_buffer, full_output, message_length);
			error_buffer += message_length;
			error_buffer_size -= message_length;
		}

		full_output += message_length + 1;
		full_output_size -= message_length + 1;
	}
}